

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<double>::apply
          (QGate2<double> *this,Op op,int nbQubits,vector<double,_std::allocator<double>_> *vector,
          int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_136_17_7d744f41 f;
  SquareMatrix<double> local_e0;
  _Vector_base<int,_std::allocator<int>_> local_d0;
  anon_class_136_17_7d744f41 local_b8;
  
  (*(this->super_QObject<double>)._vptr_QObject[5])(&local_d0,this);
  *(ulong *)local_d0._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_d0._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_d0._M_impl.super__Vector_impl_data._M_start);
  (*(this->super_QObject<double>)._vptr_QObject[7])(&local_e0,this);
  lambda_QGate2<double>
            (&local_b8,op,&local_e0,
             (vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&local_e0.data_);
  apply4<qclab::qgates::lambda_QGate2<double>(qclab::Op,qclab::dense::SquareMatrix<double>,double*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_d0._M_impl.super__Vector_impl_data._M_start,
             local_d0._M_impl.super__Vector_impl_data._M_start[1],&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d0);
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }